

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineBlendTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::BlendTest::createInstance(BlendTest *this,Context *context)

{
  BlendTestInstance *this_00;
  Context *context_local;
  BlendTest *this_local;
  
  this_00 = (BlendTestInstance *)operator_new(0x310);
  BlendTestInstance::BlendTestInstance(this_00,context,this->m_colorFormat,this->m_blendStates);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* BlendTest::createInstance(Context& context) const
{
	return new BlendTestInstance(context, m_colorFormat, m_blendStates);
}